

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall
Highs::formIllConditioningLp1
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint,double ill_conditioning_bound)

{
  reference pvVar1;
  reference pvVar2;
  size_type sVar3;
  byte in_CL;
  int *in_RSI;
  long in_RDI;
  HighsInt iRow_7;
  HighsInt iRow_6;
  HighsInt iRow_5;
  HighsInt iRow_4;
  HighsInt iRow_3;
  HighsInt iRow_2;
  HighsInt iRow_1;
  HighsInt iEl;
  HighsInt iCol;
  HighsSparseMatrix *ill_conditioning_matrix;
  HighsSparseMatrix *incumbent_matrix;
  HighsInt iRow;
  HighsInt c5_offset;
  HighsInt c6_offset;
  HighsInt c7_offset;
  HighsInt c1_offset;
  HighsInt c4_offset;
  HighsInt incumbent_num_row;
  HighsLp *incumbent_lp;
  value_type *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  value_type_conflict1 *in_stack_fffffffffffffab8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffac0;
  int *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  vector<double,_std::allocator<double>_> local_438;
  string local_418 [36];
  undefined4 local_3f4;
  undefined8 local_3f0;
  int local_3e4;
  undefined8 local_3e0;
  undefined8 local_3d8;
  string local_3d0 [32];
  string local_3b0 [36];
  int local_38c;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined4 local_36c;
  undefined8 local_368;
  undefined8 local_360;
  int local_354;
  undefined8 local_350;
  undefined8 local_348;
  string local_340 [32];
  string local_320 [36];
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 local_2f0;
  int local_2e4;
  undefined8 local_2e0;
  undefined8 local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  int local_290;
  undefined4 local_28c;
  undefined8 local_288;
  int local_27c;
  undefined8 local_278;
  int local_26c;
  undefined8 local_268;
  undefined8 local_260;
  string local_258 [32];
  string local_238 [36];
  undefined4 local_214;
  undefined8 local_210;
  int local_204;
  undefined8 local_200;
  int local_1f4;
  undefined8 local_1f0;
  undefined8 local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  int local_1a0;
  undefined4 local_19c;
  undefined8 local_198;
  int local_190;
  undefined4 local_18c;
  int local_188;
  undefined4 local_184;
  undefined8 local_180;
  int local_178;
  undefined4 local_174;
  undefined8 local_170;
  undefined8 local_168;
  int local_15c;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  string local_140 [32];
  string local_120 [36];
  int local_fc;
  int local_f8;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 local_e8;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  int *local_70;
  int *local_68;
  undefined8 local_60;
  undefined8 local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  int *local_30;
  byte local_19;
  int *local_10;
  
  local_19 = in_CL & 1;
  local_30 = (int *)(in_RDI + 0x138);
  local_3c = *(int *)(in_RDI + 0x13c);
  local_38 = 0;
  local_40 = local_3c << 1;
  local_44 = local_3c * 3;
  local_48 = local_3c * 3 + 1;
  local_34 = local_3c;
  local_10 = in_RSI;
  for (local_4c = 0; local_4c < local_44; local_4c = local_4c + 1) {
    local_58 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_60 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
  }
  local_68 = local_30 + 0x20;
  HighsSparseMatrix::ensureColwise
            ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  local_70 = local_10 + 0x20;
  *local_10 = 0;
  for (local_74 = 0; local_74 < *local_30; local_74 = local_74 + 1) {
    pvVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDI + 0xa0),(long)local_74);
    if (*pvVar1 == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                 (value_type_conflict2 *)in_stack_fffffffffffffab8);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      local_d0 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      local_d8 = 0xfff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_68 + 4),(long)local_74);
      local_dc = *pvVar2;
      while (in_stack_fffffffffffffb84 = local_dc,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_68 + 4),
                                (long)(local_74 + 1)), in_stack_fffffffffffffb84 < *pvVar2) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(local_68 + 0x10),(long)local_dc);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                   (value_type_conflict2 *)in_stack_fffffffffffffab8);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_68 + 0x16),(long)local_dc);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        local_dc = local_dc + 1;
      }
      if ((local_19 & 1) == 0) {
        local_e0 = local_3c + *local_10;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict2 *)in_stack_fffffffffffffaa8);
        local_e8 = 0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict1 *)in_stack_fffffffffffffaa8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                   (value_type_conflict2 *)in_stack_fffffffffffffab8);
        local_f0 = 0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      }
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
      local_f4 = (undefined4)sVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict2 *)in_stack_fffffffffffffaa8);
      *local_10 = *local_10 + 1;
    }
  }
  for (local_f8 = 0; local_f8 < local_34; local_f8 = local_f8 + 1) {
    pvVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDI + 0xb8),(long)local_f8);
    if (*pvVar1 == kBasic) {
      local_fc = *local_30 + local_f8;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict2 *)in_stack_fffffffffffffaa8);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      local_148 = 0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      local_150 = 0xfff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                 (value_type_conflict2 *)in_stack_fffffffffffffab8);
      local_158 = 0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      if ((local_19 & 1) == 0) {
        local_15c = local_3c + *local_10;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict2 *)in_stack_fffffffffffffaa8);
        local_168 = 0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict1 *)in_stack_fffffffffffffaa8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                   (value_type_conflict2 *)in_stack_fffffffffffffab8);
        local_170 = 0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                   (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      }
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
      local_174 = (undefined4)sVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict2 *)in_stack_fffffffffffffaa8);
      *local_10 = *local_10 + 1;
    }
  }
  if ((local_19 & 1) != 0) {
    for (local_178 = 0; local_178 < local_34; local_178 = local_178 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                 (value_type_conflict2 *)in_stack_fffffffffffffab8);
      local_180 = 0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
      local_184 = (undefined4)sVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    }
    for (local_188 = 0; local_188 < local_34; local_188 = local_188 + 1) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
      local_18c = (undefined4)sVar3;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    }
    for (local_190 = 0; local_190 < local_34; local_190 = local_190 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
                 (value_type_conflict2 *)in_stack_fffffffffffffab8);
      local_198 = 0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
                 (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_19c = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_70[1] = local_44 + 1;
    local_70[2] = local_34;
    HighsSparseMatrix::ensureRowwise
              ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    *local_70 = 1;
    local_70[1] = local_34;
    local_70[2] = local_44 + 1;
  }
  local_10[1] = local_34 * 3 + 2;
  for (local_1a0 = 0; local_1a0 < local_34; local_1a0 = local_1a0 + 1) {
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
    local_1e8 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_1f0 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_1f4 = local_3c + local_1a0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_200 = 0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_204 = local_40 + local_1a0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_210 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_214 = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_258);
    local_260 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_268 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_26c = local_3c + local_1a0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_278 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_27c = local_40 + local_1a0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_288 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_28c = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
  }
  for (local_290 = 0; local_290 < local_34; local_290 = local_290 + 1) {
    in_stack_fffffffffffffaf8 = local_10 + 0x52;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_2d0);
    local_2d8 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_2e0 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_2e4 = local_290;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_2f0 = 0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
               (value_type_conflict2 *)in_stack_fffffffffffffab8);
    local_2f8 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_2fc = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_340);
    local_348 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_350 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_354 = local_290;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_360 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0,
               (value_type_conflict2 *)in_stack_fffffffffffffab8);
    local_368 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_36c = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
  }
  local_378 = 0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
             (value_type_conflict1 *)in_stack_fffffffffffffaa8);
  local_380 = 0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
             (value_type_conflict1 *)in_stack_fffffffffffffaa8);
  local_388 = 0xfff0000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
             (value_type_conflict1 *)in_stack_fffffffffffffaa8);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  for (local_38c = 0; local_38c < local_34; local_38c = local_38c + 1) {
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_3d0);
    local_3d8 = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    local_3e0 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_3e4 = local_40 + local_38c;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    local_3f0 = 0xbff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffab0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 4);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    local_3f4 = (undefined4)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
    in_stack_fffffffffffffab8 = (value_type_conflict1 *)(local_10 + 0x52);
    in_stack_fffffffffffffac0 = &local_438;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict1 *)in_stack_fffffffffffffaa8);
    in_stack_fffffffffffffaa8 = (value_type *)(local_70 + 4);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(local_70 + 0x10));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffab0,
               (value_type_conflict2 *)in_stack_fffffffffffffaa8);
    *local_10 = *local_10 + 1;
  }
  local_70[1] = *local_10;
  local_70[2] = local_10[1];
  return;
}

Assistant:

void Highs::formIllConditioningLp1(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint,
                                   const double ill_conditioning_bound) {
  HighsLp& incumbent_lp = this->model_.lp_;
  const HighsInt incumbent_num_row = incumbent_lp.num_row_;
  //
  // Using notation from Klotz14
  //
  // For constraint view, conditioning LP minimizes the
  // infeasibilities of c7
  //
  // c4: B^Ty         -   s +   t   = 0
  // c1:    y - u + w               = 0
  // c7:        u + w               = 0
  // c6: e^Ty                       = 1
  // c5:               e^Ts + e^Tt <= eps
  // y free; u, w, s, t >= 0
  //
  // Column view uses B rather than B^T
  //
  // Set up offsets
  //
  const HighsInt c4_offset = 0;
  const HighsInt c1_offset = incumbent_num_row;
  const HighsInt c7_offset = 2 * incumbent_num_row;
  const HighsInt c6_offset = 3 * incumbent_num_row;
  const HighsInt c5_offset = 3 * incumbent_num_row + 1;
  for (HighsInt iRow = 0; iRow < c6_offset; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  // Form the basis matrix and
  //
  // * For constraint view, add the identity matrix and vector of
  // * ones, and transpose the resulting matrix
  //
  // * For column view, add an identity matrix column and unit entry
  // * below each column
  //
  ill_conditioning_lp.num_col_ = 0;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into ill-conditioning LP, possibly with
    // identity matrix column for constraint y - u + w = 0 and unit
    // entry for e^Ty = 1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }

  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  if (constraint) {
    // Add the identity matrix for constraint y - u + w = 0
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    }
    // Add the square zero matrix of c7
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++)
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    // Add the vector of ones for e^Ty = 1
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));

    // Transpose the resulting matrix
    ill_conditioning_matrix.num_col_ = c6_offset + 1;
    ill_conditioning_matrix.num_row_ = incumbent_num_row;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
    ill_conditioning_matrix.num_col_ = incumbent_num_row;
    ill_conditioning_matrix.num_row_ = c6_offset + 1;
  }

  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  ill_conditioning_lp.num_row_ = 3 * incumbent_num_row + 2;

  // Now add the variables u and w
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding u with cost 0
    ill_conditioning_lp.col_names_.push_back("u_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding w with cost 0
    ill_conditioning_lp.col_names_.push_back("w_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Now add the variables s and t
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding s with cost 0
    ill_conditioning_lp.col_names_.push_back("s_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding t with cost 0
    ill_conditioning_lp.col_names_.push_back("t_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Add the bounds for c6: e^Ty = 1
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  // Add the bounds for c5: e^Ts + e^Tt <= eps
  assert(ill_conditioning_bound > 0);
  ill_conditioning_lp.row_lower_.push_back(-kHighsInf);
  ill_conditioning_lp.row_upper_.push_back(ill_conditioning_bound);
  assert(HighsInt(ill_conditioning_lp.row_lower_.size()) ==
         ill_conditioning_lp.num_row_);
  assert(HighsInt(ill_conditioning_lp.row_upper_.size()) ==
         ill_conditioning_lp.num_row_);

  // Now add the variables to measure the infeasibilities in
  //
  // c7: u + w = r^+ - r^-
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding r^+ with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsPlus_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding r^- with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsMinus_" +
                                             std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == 7 * incumbent_num_row);
  assert(ill_conditioning_lp.num_row_ == 3 * incumbent_num_row + 2);
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}